

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9WriteSim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int nWords;
  char *pcVar5;
  char *pcVar6;
  Vec_Wrd_t *p;
  
  bVar3 = false;
  Extra_UtilGetoptReset();
  bVar2 = false;
  while( true ) {
    while (iVar4 = Extra_UtilGetopt(argc,argv,"ovh"), iVar4 == 0x6f) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (iVar4 == -1) break;
    if (iVar4 != 0x76) {
      Abc_Print(-2,"usage: &sim_write [-vh] <file>\n");
      Abc_Print(-2,"\t         writes simulation patterns into a file\n");
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (!bVar2) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-o     : toggle writing output information [default = %s]\n",pcVar5);
      if (!bVar3) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      pcVar5 = "\t<file> : file to store the simulation info\n";
      iVar4 = -2;
LAB_0027bf08:
      Abc_Print(iVar4,pcVar5);
      return 1;
    }
    bVar3 = (bool)(bVar3 ^ 1);
  }
  pGVar1 = pAbc->pGia;
  if (pGVar1 == (Gia_Man_t *)0x0) {
    pcVar5 = "Abc_CommandAbc9WriteSim(): There is no AIG.\n";
  }
  else {
    if (0 < pGVar1->nRegs) {
      pcVar5 = "Abc_CommandAbc9WriteSim(): This command works only for combinational AIGs.\n";
LAB_0027be5a:
      Abc_Print(-1,pcVar5);
      return 0;
    }
    if ((&pGVar1->vSimsPi)[bVar2] == (Vec_Wrd_t *)0x0) {
      pcVar5 = "Abc_CommandAbc9WriteSim(): Does not have simulation information available.\n";
      goto LAB_0027be5a;
    }
    if (argc - globalUtilOptind == 1) {
      if (bVar2) {
        p = pGVar1->vSimsPo;
        iVar4 = pGVar1->vCos->nSize;
        nWords = p->nSize / iVar4;
        if (p->nSize % iVar4 != 0) {
          __assert_fail("Vec_WrdSize(pAbc->pGia->vSimsPo) % Gia_ManCoNum(pAbc->pGia) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abc.c"
                        ,0x814e,"int Abc_CommandAbc9WriteSim(Abc_Frame_t *, int, char **)");
        }
      }
      else {
        p = pGVar1->vSimsPi;
        iVar4 = pGVar1->vCis->nSize;
        nWords = p->nSize / iVar4;
        if (p->nSize % iVar4 != 0) {
          __assert_fail("Vec_WrdSize(pAbc->pGia->vSimsPi) % Gia_ManCiNum(pAbc->pGia) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abc.c"
                        ,0x8153,"int Abc_CommandAbc9WriteSim(Abc_Frame_t *, int, char **)");
        }
      }
      Vec_WrdDumpHex(argv[globalUtilOptind],p,nWords,globalUtilOptind);
      return 0;
    }
    pcVar5 = "File name is not given on the command line.\n";
  }
  iVar4 = -1;
  goto LAB_0027bf08;
}

Assistant:

int Abc_CommandAbc9WriteSim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fOutputs = 0, fVerbose = 0;
    char ** pArgvNew;
    int nArgcNew;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'o':
            fOutputs ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9WriteSim(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) > 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9WriteSim(): This command works only for combinational AIGs.\n" );
        return 0;
    }
    if ( (fOutputs ? pAbc->pGia->vSimsPo : pAbc->pGia->vSimsPi) == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9WriteSim(): Does not have simulation information available.\n" );
        return 0;
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }
    if ( fOutputs )
    {
        assert( Vec_WrdSize(pAbc->pGia->vSimsPo) % Gia_ManCoNum(pAbc->pGia) == 0 );
        Vec_WrdDumpHex( pArgvNew[0], pAbc->pGia->vSimsPo, Vec_WrdSize(pAbc->pGia->vSimsPo) / Gia_ManCoNum(pAbc->pGia), 1 );
    }
    else
    {
        assert( Vec_WrdSize(pAbc->pGia->vSimsPi) % Gia_ManCiNum(pAbc->pGia) == 0 );
        Vec_WrdDumpHex( pArgvNew[0], pAbc->pGia->vSimsPi, Vec_WrdSize(pAbc->pGia->vSimsPi) / Gia_ManCiNum(pAbc->pGia), 1 );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &sim_write [-vh] <file>\n" );
    Abc_Print( -2, "\t         writes simulation patterns into a file\n" );
    Abc_Print( -2, "\t-o     : toggle writing output information [default = %s]\n", fOutputs? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file to store the simulation info\n");
    return 1;
}